

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall ProString::operator==(ProString *this,QLatin1String other)

{
  bool bVar1;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QStringView *this_00;
  QStringView *n;
  qsizetype in_stack_ffffffffffffffb8;
  QString local_18;
  
  local_18.d.size = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  n = in_RDI;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),&local_18)
  ;
  QStringView::mid(this_00,in_stack_ffffffffffffffb8,(qsizetype)n);
  bVar1 = ::operator==(in_RDI,in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18.d.size) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(QLatin1String other) const  { return toQStringView() == other; }